

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O2

void move_deviceOrModule_members_to_deviceEx
               (IOTHUB_DEVICE_OR_MODULE *deviceOrModule,IOTHUB_DEVICE_EX *device)

{
  char *pcVar1;
  
  if ((deviceOrModule != (IOTHUB_DEVICE_OR_MODULE *)0x0) && (0 < device->version)) {
    pcVar1 = deviceOrModule->primaryKey;
    device->deviceId = deviceOrModule->deviceId;
    device->primaryKey = pcVar1;
    pcVar1 = deviceOrModule->generationId;
    device->secondaryKey = deviceOrModule->secondaryKey;
    device->generationId = pcVar1;
    device->eTag = deviceOrModule->eTag;
    device->connectionState = deviceOrModule->connectionState;
    device->connectionStateUpdatedTime = deviceOrModule->connectionStateUpdatedTime;
    device->status = deviceOrModule->status;
    pcVar1 = deviceOrModule->statusUpdatedTime;
    device->statusReason = deviceOrModule->statusReason;
    device->statusUpdatedTime = pcVar1;
    device->lastActivityTime = deviceOrModule->lastActivityTime;
    device->cloudToDeviceMessageCount = deviceOrModule->cloudToDeviceMessageCount;
    device->isManaged = deviceOrModule->isManaged;
    pcVar1 = deviceOrModule->deviceProperties;
    device->configuration = deviceOrModule->configuration;
    device->deviceProperties = pcVar1;
    device->serviceProperties = deviceOrModule->serviceProperties;
    device->authMethod = deviceOrModule->authMethod;
    device->iotEdge_capable = deviceOrModule->iotEdge_capable;
  }
  return;
}

Assistant:

static void move_deviceOrModule_members_to_deviceEx(IOTHUB_DEVICE_OR_MODULE* deviceOrModule, IOTHUB_DEVICE_EX* device)
{
    if ((deviceOrModule != NULL) && (device != NULL))
    {
        if (device->version >= IOTHUB_DEVICE_EX_VERSION_1)
        {
            device->deviceId = deviceOrModule->deviceId;
            device->primaryKey = deviceOrModule->primaryKey;
            device->secondaryKey = deviceOrModule->secondaryKey;
            device->generationId = deviceOrModule->generationId;
            device->eTag = deviceOrModule->eTag;
            device->connectionState = deviceOrModule->connectionState;
            device->connectionStateUpdatedTime = deviceOrModule->connectionStateUpdatedTime;
            device->status = deviceOrModule->status;
            device->statusReason = deviceOrModule->statusReason;
            device->statusUpdatedTime = deviceOrModule->statusUpdatedTime;
            device->lastActivityTime = deviceOrModule->lastActivityTime;
            device->cloudToDeviceMessageCount = deviceOrModule->cloudToDeviceMessageCount;
            device->isManaged = deviceOrModule->isManaged;
            device->configuration = deviceOrModule->configuration;
            device->deviceProperties = deviceOrModule->deviceProperties;
            device->serviceProperties = deviceOrModule->serviceProperties;
            device->authMethod = deviceOrModule->authMethod;
            device->iotEdge_capable = deviceOrModule->iotEdge_capable;
        }
    }
}